

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsonobject.cpp
# Opt level: O2

iterator __thiscall
QJsonObject::insertImpl<QLatin1String>(QJsonObject *this,QLatin1String key,QJsonValue *value)

{
  Type TVar1;
  qsizetype pos;
  long in_FS_OFFSET;
  iterator iVar2;
  bool keyExists;
  bool local_31;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  TVar1 = QJsonValue::type(value);
  if (TVar1 == Undefined) {
    removeImpl<QLatin1String>(this,key);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      iVar2 = end(this);
      return (QJsonValueRef)(QJsonValueRef)iVar2;
    }
  }
  else {
    local_31 = false;
    if ((this->o).d.ptr == (QCborContainerPrivate *)0x0) {
      pos = 0;
    }
    else {
      pos = indexOf<QLatin1String>(&this->o,key,&local_31);
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      iVar2 = insertAt<QLatin1String>(this,pos,key,value,(bool)(local_31 & 1));
      return (QJsonValueRef)(QJsonValueRef)iVar2;
    }
  }
  __stack_chk_fail();
}

Assistant:

QJsonObject::iterator QJsonObject::insertImpl(T key, const QJsonValue &value)
{
    if (value.type() == QJsonValue::Undefined) {
        remove(key);
        return end();
    }
    bool keyExists = false;
    auto pos = o ? indexOf(o, key, &keyExists) : 0;
    return insertAt(pos, key, value, keyExists);
}